

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SplitLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_split(NeuralNetworkLayer *this)

{
  SplitLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x14a) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x14a;
    this_00 = (SplitLayerParams *)operator_new(0x20);
    SplitLayerParams::SplitLayerParams(this_00);
    (this->layer_).split_ = this_00;
  }
  return (SplitLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SplitLayerParams* NeuralNetworkLayer::mutable_split() {
  if (!has_split()) {
    clear_layer();
    set_has_split();
    layer_.split_ = new ::CoreML::Specification::SplitLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.split)
  return layer_.split_;
}